

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O2

void trstep(double *jac,double *sN,int N,double *dx,double *L,double *hess,double nlen,double *ioval
           ,double eps,double *step)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  double *vec;
  double *vec_00;
  ulong uVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double local_d8;
  double local_98;
  
  dVar1 = *ioval;
  dVar15 = ioval[1];
  dVar2 = ioval[2];
  local_98 = ioval[3];
  dVar16 = ioval[4];
  local_d8 = ioval[5];
  lVar7 = (long)N;
  vec = (double *)malloc(lVar7 * 8);
  vec_00 = (double *)malloc(lVar7 * 8);
  if (dVar1 * 1.5 < nlen) {
    ioval[6] = 0.0;
    if (0.0 < dVar15) {
      dVar15 = dVar15 - (((dVar2 - dVar1) + local_98) * (dVar2 + local_98)) / (dVar1 * dVar16);
    }
    local_98 = nlen - dVar1;
    if ((ioval[7] != 1.0) || (NAN(ioval[7]))) {
      uVar12 = 0;
      if (0 < N) {
        uVar12 = (ulong)(uint)N;
      }
    }
    else {
      ioval[7] = 0.0;
      uVar8 = 0;
      uVar12 = 0;
      if (0 < N) {
        uVar12 = (ulong)(uint)N;
      }
      for (; uVar12 != uVar8; uVar8 = uVar8 + 1) {
        vec[uVar8] = dx[uVar8] * dx[uVar8] * sN[uVar8];
      }
      *vec_00 = *vec / *L;
      pdVar9 = L + lVar7;
      for (lVar10 = 1; lVar10 < lVar7; lVar10 = lVar10 + 1) {
        dVar3 = 0.0;
        for (lVar11 = 0; lVar10 != lVar11; lVar11 = lVar11 + 1) {
          dVar3 = dVar3 + vec_00[lVar11] * pdVar9[lVar11];
        }
        vec_00[lVar10] = (vec[lVar10] - dVar3) / L[lVar10 + (int)lVar10 * N];
        pdVar9 = pdVar9 + lVar7;
      }
      dVar3 = l2norm(vec_00,N);
      local_d8 = (-dVar3 * dVar3) / nlen;
    }
    for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
      vec[uVar8] = jac[uVar8] / dx[uVar8];
    }
    dVar14 = -local_98 / local_d8;
    dVar3 = l2norm(vec,N);
    dVar3 = dVar3 / dVar1;
    do {
      dVar13 = dVar3 * dVar14;
      bVar5 = true;
      do {
        nlen = dVar1;
        if (!bVar5) goto LAB_001248a5;
        if ((dVar15 < dVar14) || (dVar3 < dVar15)) {
          dVar15 = SQRT(dVar13);
          if (dVar13 < 0.0) {
            dVar15 = sqrt(dVar13);
          }
          if (dVar15 <= dVar3 * 0.001) {
            dVar15 = dVar3 * 0.001;
          }
        }
        iVar6 = 0;
        for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
          hess[iVar6] = dVar15 * dx[uVar8] * dx[uVar8] + hess[iVar6];
          iVar6 = iVar6 + N + 1;
        }
        cholmod(hess,N,L,eps,0.0);
        scale(jac,1,N,-1.0);
        linsolve_lower(L,N,jac,step);
        scale(jac,1,N,-1.0);
        iVar6 = 0;
        for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
          hess[iVar6] = dx[uVar8] * -dVar15 * dx[uVar8] + hess[iVar6];
          iVar6 = iVar6 + N + 1;
        }
        for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
          vec[uVar8] = step[uVar8] * dx[uVar8];
        }
        dVar4 = l2norm(vec,N);
        for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
          vec[uVar8] = dx[uVar8] * vec[uVar8];
        }
        *vec_00 = *vec / *L;
        pdVar9 = L + lVar7;
        for (lVar10 = 1; lVar10 < lVar7; lVar10 = lVar10 + 1) {
          dVar16 = 0.0;
          for (lVar11 = 0; lVar10 != lVar11; lVar11 = lVar11 + 1) {
            dVar16 = dVar16 + vec_00[lVar11] * pdVar9[lVar11];
          }
          vec_00[lVar10] = (vec[lVar10] - dVar16) / L[lVar10 + (int)lVar10 * N];
          pdVar9 = pdVar9 + lVar7;
        }
        local_98 = dVar4 - dVar1;
        dVar16 = l2norm(vec_00,N);
        dVar16 = (-dVar16 * dVar16) / dVar4;
        bVar5 = false;
      } while ((dVar1 * 0.75 <= dVar4 && dVar4 <= dVar1 * 1.5) || (0.0 <= dVar3 - dVar14));
      dVar13 = dVar15 - local_98 / dVar16;
      uVar8 = -(ulong)(dVar14 <= dVar13);
      dVar14 = (double)(-(ulong)(local_98 < 0.0) & (ulong)dVar15 |
                       ~-(ulong)(local_98 < 0.0) & (~uVar8 & (ulong)dVar14 | (ulong)dVar13 & uVar8))
      ;
      dVar15 = dVar15 - (dVar4 * local_98) / (dVar1 * dVar16);
    } while( true );
  }
  ioval[6] = 1.0;
  uVar8 = 0;
  uVar12 = (ulong)(uint)N;
  if (N < 1) {
    uVar12 = 0;
  }
  for (; uVar12 != uVar8; uVar8 = uVar8 + 1) {
    step[uVar8] = sN[uVar8];
  }
  dVar15 = 0.0;
  if (dVar1 <= nlen) {
    nlen = dVar1;
  }
LAB_001248a5:
  *ioval = nlen;
  ioval[1] = dVar15;
  ioval[2] = dVar2;
  ioval[3] = local_98;
  ioval[4] = dVar16;
  ioval[5] = local_d8;
  free(vec);
  free(vec_00);
  return;
}

Assistant:

void trstep(double *jac,double *sN,int N,double * dx,double *L,double *hess,double nlen,double *ioval,double eps,
		double *step) {
	int i,c1,iter,j;
	double sum,tvec,l1,l2,maxadd,steplen;
	double hi,lo,lambdalo,lambdahi;
	double delta,lambda,deltaprev,phi,phid,phidinit;
	double *temp1,*temp2;
	
	hi = 1.5;lo = 0.75;
	delta = ioval[0];lambda = ioval[1]; deltaprev = ioval[2];
	phi = ioval[3]; phid = ioval[4] ; phidinit = ioval[5];
	temp1 = (double*) malloc(sizeof(double) *N);
	temp2 = (double*) malloc(sizeof(double) *N);
	
	if (nlen <= hi*delta) {
		ioval[6] = 1.0;
		for(i=0;i <N;++i) {
			step[i] = sN[i];
		}
		lambda = 0.;
		if (delta > nlen) {
			delta = nlen;
		}
		
	} else {
			ioval[6] = 0.0;
			if (lambda > 0.) {
				lambda -= (phi+deltaprev) * ((deltaprev - delta) + phi) /(delta * phid);
			}
			phi = nlen - delta;
			if (ioval[7] == 1.0) {
				ioval[7] = 0.0;
				for(i=0;i < N;++i) {
					temp1[i] = dx[i] * dx[i] * sN[i];
				}
				temp2[0] = temp1[0]/L[0];
				for(i = 1; i < N; ++i) {
					sum = 0.;
					c1 = i*N;
					for(j = 0; j < i; ++j) {
						sum += temp2[j] * L[c1 + j];
					}
					temp2[i] = (temp1[i] - sum)/L[c1+i];
				}
				tvec = l2norm(temp2,N);
				phidinit = - tvec*tvec/nlen;
			}
			lambdalo = - phi/phidinit;
			for(i=0;i < N;++i) {
				temp1[i] = jac[i]/dx[i];
			}
			tvec = l2norm(temp1,N);
			lambdahi = tvec / delta;
			iter = 0;
			while (iter == 0) {
				if (lambda < lambdalo || lambda > lambdahi) {
					l1 = sqrt(lambdalo * lambdahi);
					l2 = 0.001 *lambdahi;
					if (l1 > l2) {
						lambda = l1;
					} else {
						lambda = l2;
					}
				}
				
				for(i = 0; i < N;++i) {
					c1 = i*N;
					hess[c1+i] += lambda * dx[i] * dx[i];
				}
				maxadd = cholmod(hess,N,L,eps,0.0);
				scale(jac,1,N,-1.0);
				linsolve_lower(L,N,jac,step);
				scale(jac,1,N,-1.0);
				for(i = 0; i < N;++i) {
					c1 = i*N;
					hess[c1+i] -= lambda * dx[i] * dx[i];
				}
				for(i=0;i < N;++i) {
					temp1[i] = step[i] * dx[i];
				}
				steplen = l2norm(temp1,N);
				phi = steplen - delta;
				for(i=0;i < N;++i) {
					temp1[i] *= dx[i];
				}
				temp2[0] = temp1[0]/L[0];
				for(i = 1; i < N; ++i) {
					sum = 0.;
					c1 = i*N;
					for(j = 0; j < i; ++j) {
						sum += temp2[j] * L[c1 + j];
					}
					temp2[i] = (temp1[i] - sum)/L[c1+i];
				}
				tvec = l2norm(temp2,N);
				phid = - tvec*tvec/steplen;
				
				if ( (steplen >= lo * delta && steplen <= hi * delta ) || (lambdahi - lambdalo >= 0))  {
					iter = 1;
				} else {
					if (lambdalo <= lambda - (phi/phid)) {
						lambdalo = lambda - (phi/phid);
					}
					if (phi < 0) {
						lambdalo = lambda;
					}
					
					lambda -= (steplen *phi)/(delta*phid);
				}
				
			}
			
	}
	
	ioval[0] = delta;ioval[1] =lambda; ioval[2] = deltaprev;
	ioval[3] = phi; ioval[4] = phid ;ioval[5] = phidinit;
	
	free(temp1);
	free(temp2);
}